

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::PerfEventConfig::PerfEventConfig
          (PerfEventConfig *this,PerfEventConfig *param_1)

{
  uint32_t uVar1;
  undefined3 uVar2;
  PerfEventConfig *param_1_local;
  PerfEventConfig *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__PerfEventConfig_009c1500;
  protozero::CopyablePtr<perfetto::protos::gen::PerfEvents_Timebase>::CopyablePtr
            (&this->timebase_,&param_1->timebase_);
  protozero::CopyablePtr<perfetto::protos::gen::PerfEventConfig_CallstackSampling>::CopyablePtr
            (&this->callstack_sampling_,&param_1->callstack_sampling_);
  uVar1 = param_1->ring_buffer_pages_;
  this->ring_buffer_read_period_ms_ = param_1->ring_buffer_read_period_ms_;
  this->ring_buffer_pages_ = uVar1;
  this->max_enqueued_footprint_kb_ = param_1->max_enqueued_footprint_kb_;
  uVar1 = param_1->remote_descriptor_timeout_ms_;
  this->max_daemon_memory_kb_ = param_1->max_daemon_memory_kb_;
  this->remote_descriptor_timeout_ms_ = uVar1;
  this->unwind_state_clear_period_ms_ = param_1->unwind_state_clear_period_ms_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->target_installed_by_,&param_1->target_installed_by_);
  uVar2 = *(undefined3 *)&param_1->field_0x51;
  uVar1 = param_1->sampling_frequency_;
  this->all_cpus_ = param_1->all_cpus_;
  *(undefined3 *)&this->field_0x51 = uVar2;
  this->sampling_frequency_ = uVar1;
  this->kernel_frames_ = param_1->kernel_frames_;
  std::vector<int,_std::allocator<int>_>::vector(&this->target_pid_,&param_1->target_pid_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->target_cmdline_,&param_1->target_cmdline_);
  std::vector<int,_std::allocator<int>_>::vector(&this->exclude_pid_,&param_1->exclude_pid_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->exclude_cmdline_,&param_1->exclude_cmdline_);
  this->additional_cmdline_count_ = param_1->additional_cmdline_count_;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

PerfEventConfig::PerfEventConfig(PerfEventConfig&&) noexcept = default;